

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

void __thiscall
Memory::HeapInfo::SweepSmallNonFinalizable(HeapInfo *this,RecyclerSweep *recyclerSweep)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  long lVar4;
  
  RecyclerSweep::
  MergePendingNewHeapBlockList<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
            (recyclerSweep);
  RecyclerSweep::
  MergePendingNewHeapBlockList<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
            (recyclerSweep);
  RecyclerSweep::
  MergePendingNewMediumHeapBlockList<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>>
            (recyclerSweep);
  RecyclerSweep::
  MergePendingNewMediumHeapBlockList<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>>
            (recyclerSweep);
  RecyclerSweep::
  MergePendingNewHeapBlockList<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
            (recyclerSweep);
  RecyclerSweep::
  MergePendingNewMediumHeapBlockList<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
            (recyclerSweep);
  bVar2 = RecyclerSweep::HasPendingNewHeapBlocks(recyclerSweep);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x44e,"(!recyclerSweep.HasPendingNewHeapBlocks())",
                       "!recyclerSweep.HasPendingNewHeapBlocks()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = RecyclerSweep::IsBackground(recyclerSweep);
  if (!bVar2) {
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::SuspendIdleDecommit(&this->recyclerLeafPageAllocator->super_PageAllocator);
  }
  lVar4 = 0x78;
  do {
    HeapBucketGroup<SmallAllocationBlockAttributes>::Sweep
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar4),recyclerSweep);
    lVar4 = lVar4 + 0x380;
  } while (lVar4 != 0xa878);
  lVar4 = 0xa878;
  do {
    HeapBucketGroup<MediumAllocationBlockAttributes>::Sweep
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar4),recyclerSweep);
    lVar4 = lVar4 + 0x380;
  } while (lVar4 != 0x10df8);
  bVar2 = RecyclerSweep::IsBackground(recyclerSweep);
  if (bVar2) {
    return;
  }
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::ResumeIdleDecommit(&this->recyclerLeafPageAllocator->super_PageAllocator);
  GetSmallHeapBlockCount(this,true);
  GetLargeHeapBlockCount(this,true);
  return;
}

Assistant:

void
HeapInfo::SweepSmallNonFinalizable(RecyclerSweep& recyclerSweep)
{
#if ENABLE_CONCURRENT_GC
    recyclerSweep.MergePendingNewHeapBlockList<SmallLeafHeapBlock>();
    recyclerSweep.MergePendingNewHeapBlockList<SmallNormalHeapBlock>();
    recyclerSweep.MergePendingNewMediumHeapBlockList<MediumLeafHeapBlock>();
    recyclerSweep.MergePendingNewMediumHeapBlockList<MediumNormalHeapBlock>();
#ifdef RECYCLER_WRITE_BARRIER
    recyclerSweep.MergePendingNewHeapBlockList<SmallNormalWithBarrierHeapBlock>();
    recyclerSweep.MergePendingNewMediumHeapBlockList<MediumNormalWithBarrierHeapBlock>();
#endif

    // Finalizable are already merge before in SweepHeap
    Assert(!recyclerSweep.HasPendingNewHeapBlocks());
#endif
    if (!recyclerSweep.IsBackground())
    {
        // finalizer may trigger arena allocations, do don't suspend the leaf (thread) page allocator
        // until  we are going to sweep leaf pages.
        this->GetRecyclerLeafPageAllocator()->SuspendIdleDecommit();
    }
    for (uint i=0; i<HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].Sweep(recyclerSweep);
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].Sweep(recyclerSweep);
    }
#endif

    if (!recyclerSweep.IsBackground())
    {
        // large block don't use the leaf page allocator, we can resume idle decommit now
        this->GetRecyclerLeafPageAllocator()->ResumeIdleDecommit();

        RECYCLER_SLOW_CHECK(VerifySmallHeapBlockCount());
        RECYCLER_SLOW_CHECK(VerifyLargeHeapBlockCount());
    }
}